

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O0

void Diligent::CreateDefaultShaderSourceStreamFactory
               (Char *SearchDirectories,
               IShaderSourceInputStreamFactory **ppShaderSourceStreamFactory)

{
  Char *pCVar1;
  MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,_Diligent::IMemoryAllocator> local_a0;
  DefaultShaderSourceStreamFactory *local_78;
  DefaultShaderSourceStreamFactory *pStreamFactory;
  IMemoryAllocator *Allocator;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IShaderSourceInputStreamFactory **ppShaderSourceStreamFactory_local;
  Char *SearchDirectories_local;
  
  msg.field_2._8_8_ = ppShaderSourceStreamFactory;
  ppShaderSourceStreamFactory_local = (IShaderSourceInputStreamFactory **)SearchDirectories;
  if (ppShaderSourceStreamFactory == (IShaderSourceInputStreamFactory **)0x0) {
    FormatString<char[46]>
              ((string *)local_38,(char (*) [46])"ppShaderSourceStreamFactory must not be null.");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7e);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (*(long *)msg.field_2._8_8_ != 0) {
    FormatString<char[95]>
              ((string *)&Allocator,
               (char (*) [95])
               "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks."
              );
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CreateDefaultShaderSourceStreamFactory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x7f);
    std::__cxx11::string::~string((string *)&Allocator);
  }
  pStreamFactory = (DefaultShaderSourceStreamFactory *)GetRawAllocator();
  MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,_Diligent::IMemoryAllocator>::MakeNewRCObj
            (&local_a0,(IMemoryAllocator *)pStreamFactory,
             "DefaultShaderSourceStreamFactory instance",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
             ,0x83,(IObject *)0x0);
  local_78 = MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::DefaultShaderSourceStreamFactory,Diligent::IMemoryAllocator>
                         *)&local_a0,(char **)&ppShaderSourceStreamFactory_local);
  DefaultShaderSourceStreamFactory::QueryInterface
            (local_78,(INTERFACE_ID *)IID_IShaderSourceInputStreamFactory,
             (IObject **)msg.field_2._8_8_);
  return;
}

Assistant:

void CreateDefaultShaderSourceStreamFactory(const Char*                       SearchDirectories,
                                            IShaderSourceInputStreamFactory** ppShaderSourceStreamFactory)
{
    DEV_CHECK_ERR(ppShaderSourceStreamFactory != nullptr, "ppShaderSourceStreamFactory must not be null.");
    DEV_CHECK_ERR(*ppShaderSourceStreamFactory == nullptr, "*ppShaderSourceStreamFactory is not null. Make sure the pointer is null to avoid memory leaks.");

    auto& Allocator = GetRawAllocator();
    auto* pStreamFactory =
        NEW_RC_OBJ(Allocator, "DefaultShaderSourceStreamFactory instance", DefaultShaderSourceStreamFactory)(SearchDirectories);
    pStreamFactory->QueryInterface(IID_IShaderSourceInputStreamFactory, reinterpret_cast<IObject**>(ppShaderSourceStreamFactory));
}